

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

BOOL RemoveDirectoryA(LPCSTR lpPathName)

{
  undefined8 lpPathName_00;
  errno_t eVar1;
  BOOL BVar2;
  size_t count;
  long in_FS_OFFSET;
  DWORD local_74;
  undefined1 local_70 [4];
  DWORD dwLastError;
  PathCharString mb_dirPathString;
  
  mb_dirPathString.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  local_74 = 0;
  mb_dirPathString._32_8_ = local_70;
  mb_dirPathString.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0014ef14;
  if (lpPathName == (LPCSTR)0x0) {
    local_74 = 3;
LAB_0014eeb3:
    BVar2 = 0;
  }
  else {
    count = strlen(lpPathName);
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_70,count);
    lpPathName_00 = mb_dirPathString._32_8_;
    if (mb_dirPathString._32_8_ == 0) {
      local_74 = 8;
      goto LAB_0014eeb3;
    }
    eVar1 = strncpy_s((char *)mb_dirPathString._32_8_,count + 1,lpPathName,0x400);
    if (eVar1 != 0) {
      if (count < mb_dirPathString.m_size) {
        mb_dirPathString.m_size = count;
      }
      *(undefined1 *)(mb_dirPathString._32_8_ + mb_dirPathString.m_size) = 0;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0014ef14;
      local_74 = 0xce;
      goto LAB_0014eeb3;
    }
    if (count < mb_dirPathString.m_size) {
      mb_dirPathString.m_size = count;
    }
    *(undefined1 *)(mb_dirPathString._32_8_ + mb_dirPathString.m_size) = 0;
    BVar2 = RemoveDirectoryHelper((LPSTR)lpPathName_00,&local_74);
  }
  if (local_74 != 0) {
    SetLastError(local_74);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_70);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == mb_dirPathString.m_count) {
      return BVar2;
    }
    __stack_chk_fail();
  }
LAB_0014ef14:
  abort();
}

Assistant:

BOOL
PALAPI
RemoveDirectoryA(
         IN LPCSTR lpPathName)
{
    DWORD dwLastError = 0;
    BOOL  bRet = FALSE;
    PathCharString mb_dirPathString;
    size_t length;
    char * mb_dir;
    
    PERF_ENTRY(RemoveDirectoryA);
    ENTRY("RemoveDirectoryA(lpPathName=%p (%s))\n",
          lpPathName,
          lpPathName);

    if (lpPathName == NULL) 
    {
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }

    length = strlen(lpPathName);
    mb_dir = mb_dirPathString.OpenStringBuffer(length);
    if (NULL == mb_dir)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    
    if (strncpy_s (mb_dir, sizeof(char) * (length+1), lpPathName, MAX_LONGPATH) != SAFECRT_SUCCESS)
    {
        mb_dirPathString.CloseBuffer(length);
        WARN("mb_dir is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
        dwLastError = ERROR_FILENAME_EXCED_RANGE;
        goto done;
    }

    mb_dirPathString.CloseBuffer(length);
    bRet = RemoveDirectoryHelper (mb_dir, &dwLastError);

done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }

    LOGEXIT("RemoveDirectoryA returns BOOL %d\n", bRet);
    PERF_EXIT(RemoveDirectoryA);
    return bRet;
}